

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConstraintPrototypeSyntax *pCVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *unaff_retaddr;
  Token *in_stack_00000010;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_00000058;
  TokenList *in_stack_00000060;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  NameSyntax *in_stack_ffffffffffffffa0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  deepClone(in_stack_00000060,in_stack_00000058);
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  deepClone<slang::syntax::ClassSpecifierSyntax>
            ((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)in_stack_00000050,in_stack_00000048)
  ;
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x27e504);
  deepClone<slang::syntax::NameSyntax>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  TVar3 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConstraintPrototypeSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ClassSpecifierSyntax>&,slang::syntax::NameSyntax&,slang::parsing::Token>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (TokenList *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      (NameSyntax *)TVar3.info,in_stack_00000010);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConstraintPrototypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConstraintPrototypeSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone(node.qualifiers, alloc),
        node.keyword.deepClone(alloc),
        *deepClone(node.specifiers, alloc),
        *deepClone<NameSyntax>(*node.name, alloc),
        node.semi.deepClone(alloc)
    );
}